

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_iterate(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *dst)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  long local_48;
  utf8proc_uint8_t *end;
  utf8proc_uint32_t uc;
  utf8proc_int32_t *dst_local;
  utf8proc_ssize_t strlen_local;
  utf8proc_uint8_t *str_local;
  
  *dst = -1;
  if (strlen == 0) {
    str_local = (utf8proc_uint8_t *)0x0;
  }
  else {
    local_48 = strlen;
    if (strlen < 0) {
      local_48 = 4;
    }
    pbVar2 = str + local_48;
    pbVar3 = str + 1;
    uVar1 = (uint)*str;
    if (uVar1 < 0x80) {
      *dst = uVar1;
      str_local = (utf8proc_uint8_t *)0x1;
    }
    else if (uVar1 - 0xc2 < 0x33) {
      if (uVar1 < 0xe0) {
        if ((pbVar3 < pbVar2) && ((*pbVar3 & 0xc0) == 0x80)) {
          *dst = (uVar1 & 0x1f) << 6 | *pbVar3 & 0x3f;
          str_local = (utf8proc_uint8_t *)0x2;
        }
        else {
          str_local = (utf8proc_uint8_t *)0xfffffffffffffffd;
        }
      }
      else if (uVar1 < 0xf0) {
        if (((str + 2 < pbVar2) && ((*pbVar3 & 0xc0) == 0x80)) && ((str[2] & 0xc0) == 0x80)) {
          if ((uVar1 == 0xed) && (0x9f < *pbVar3)) {
            str_local = (utf8proc_uint8_t *)0xfffffffffffffffd;
          }
          else {
            uVar1 = (uVar1 & 0xf) << 0xc | (*pbVar3 & 0x3f) << 6 | str[2] & 0x3f;
            if (uVar1 < 0x800) {
              str_local = (utf8proc_uint8_t *)0xfffffffffffffffd;
            }
            else {
              *dst = uVar1;
              str_local = (utf8proc_uint8_t *)0x3;
            }
          }
        }
        else {
          str_local = (utf8proc_uint8_t *)0xfffffffffffffffd;
        }
      }
      else if ((((str + 3 < pbVar2) && ((*pbVar3 & 0xc0) == 0x80)) && ((str[2] & 0xc0) == 0x80)) &&
              ((str[3] & 0xc0) == 0x80)) {
        if (uVar1 == 0xf0) {
          if (*pbVar3 < 0x90) {
            return -3;
          }
        }
        else if ((uVar1 == 0xf4) && (0x8f < *pbVar3)) {
          return -3;
        }
        *dst = (uVar1 & 7) << 0x12 | (*pbVar3 & 0x3f) << 0xc | (str[2] & 0x3f) << 6 | str[3] & 0x3f;
        str_local = (utf8proc_uint8_t *)0x4;
      }
      else {
        str_local = (utf8proc_uint8_t *)0xfffffffffffffffd;
      }
    }
    else {
      str_local = (utf8proc_uint8_t *)0xfffffffffffffffd;
    }
  }
  return (utf8proc_ssize_t)str_local;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_iterate(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen, utf8proc_int32_t *dst
) {
  utf8proc_uint32_t uc;
  const utf8proc_uint8_t *end;

  *dst = -1;
  if (!strlen) return 0;
  end = str + ((strlen < 0) ? 4 : strlen);
  uc = *str++;
  if (uc < 0x80) {
    *dst = uc;
    return 1;
  }
  // Must be between 0xc2 and 0xf4 inclusive to be valid
  if ((uc - 0xc2) > (0xf4-0xc2)) return UTF8PROC_ERROR_INVALIDUTF8;
  if (uc < 0xe0) {         // 2-byte sequence
     // Must have valid continuation character
     if (str >= end || !utf_cont(*str)) return UTF8PROC_ERROR_INVALIDUTF8;
     *dst = ((uc & 0x1f)<<6) | (*str & 0x3f);
     return 2;
  }
  if (uc < 0xf0) {        // 3-byte sequence
     if ((str + 1 >= end) || !utf_cont(*str) || !utf_cont(str[1]))
        return UTF8PROC_ERROR_INVALIDUTF8;
     // Check for surrogate chars
     if (uc == 0xed && *str > 0x9f)
         return UTF8PROC_ERROR_INVALIDUTF8;
     uc = ((uc & 0xf)<<12) | ((*str & 0x3f)<<6) | (str[1] & 0x3f);
     if (uc < 0x800)
         return UTF8PROC_ERROR_INVALIDUTF8;
     *dst = uc;
     return 3;
  }
  // 4-byte sequence
  // Must have 3 valid continuation characters
  if ((str + 2 >= end) || !utf_cont(*str) || !utf_cont(str[1]) || !utf_cont(str[2]))
     return UTF8PROC_ERROR_INVALIDUTF8;
  // Make sure in correct range (0x10000 - 0x10ffff)
  if (uc == 0xf0) {
    if (*str < 0x90) return UTF8PROC_ERROR_INVALIDUTF8;
  } else if (uc == 0xf4) {
    if (*str > 0x8f) return UTF8PROC_ERROR_INVALIDUTF8;
  }
  *dst = ((uc & 7)<<18) | ((*str & 0x3f)<<12) | ((str[1] & 0x3f)<<6) | (str[2] & 0x3f);
  return 4;
}